

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::PrismaticJoint::computeChildAcc
          (PrismaticJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,LinkVelArray *linkVels,
          VectorDynSize *jntAcc,LinkAccArray *linkAccs,LinkIndex child,LinkIndex parent)

{
  ulong uVar1;
  Twist *pTVar2;
  SpatialAcc *pSVar3;
  VectorDynSize *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  VectorDynSize *in_R8;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Transform *parent_X_child;
  Transform *child_X_parent;
  double d2dist;
  double ddist;
  Twist local_200 [48];
  Twist local_1d0 [48];
  SpatialMotionVector local_1a0;
  SpatialAcc local_170;
  SpatialAcc local_140;
  SpatialAcc local_110;
  SpatialAcc local_e0;
  SpatialMotionVector local_b0;
  undefined1 local_80 [48];
  undefined8 local_50;
  SpatialAcc *local_48;
  double local_40;
  double local_38;
  VectorDynSize *local_28;
  undefined8 local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RDI + 0xc0))();
  local_38 = (double)iDynTree::VectorDynSize::operator()(in_RDX,uVar1);
  uVar1 = (**(code **)(*in_RDI + 0xc0))();
  local_40 = (double)iDynTree::VectorDynSize::operator()(local_28,uVar1);
  local_48 = (SpatialAcc *)
             (**(code **)(*in_RDI + 0x50))(in_RDI,local_10,in_stack_00000008,in_stack_00000010);
  local_50 = (**(code **)(*in_RDI + 0x50))(in_RDI,local_10,in_stack_00000010,in_stack_00000008);
  (**(code **)(*in_RDI + 0x60))(local_80,in_RDI,0,in_stack_00000008,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_b0,local_38);
  pSVar3 = local_48;
  LinkAccArray::operator()((LinkAccArray *)local_28,(LinkIndex)in_RDX);
  iDynTree::Transform::operator*((Transform *)&local_140,pSVar3);
  iDynTree::SpatialMotionVector::operator*(&local_1a0,local_40);
  iDynTree::SpatialAcc::SpatialAcc(&local_170,&local_1a0);
  iDynTree::SpatialAcc::operator+(&local_110,&local_140);
  pTVar2 = LinkVelArray::operator()((LinkVelArray *)local_28,(LinkIndex)in_RDX);
  iDynTree::Twist::Twist(local_200,&local_b0);
  iDynTree::Twist::operator*(local_1d0,pTVar2);
  iDynTree::SpatialAcc::operator+(&local_e0,&local_110);
  pSVar3 = LinkAccArray::operator()((LinkAccArray *)local_28,(LinkIndex)in_RDX);
  iDynTree::SpatialAcc::operator=(pSVar3,&local_e0);
  return;
}

Assistant:

void PrismaticJoint::computeChildAcc(const VectorDynSize &jntPos, const VectorDynSize &jntVel,
                                    const LinkVelArray &linkVels, const VectorDynSize &jntAcc,
                                    LinkAccArray &linkAccs, const LinkIndex child, const LinkIndex parent) const
{
    double ddist = jntVel(this->getDOFsOffset());
    double d2dist = jntAcc(this->getDOFsOffset());
    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);
    const Transform & parent_X_child = this->getTransform(jntPos,parent,child);
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);
    SpatialMotionVector vj = S*ddist;
    linkAccs(child) = child_X_parent*linkAccs(parent) + S*d2dist + linkVels(child)*vj;
}